

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O1

void __thiscall
Js::WebAssemblyEnvironment::CalculateOffsets
          (WebAssemblyEnvironment *this,WebAssemblyTable *table,WebAssemblyMemory *memory)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  uint uVar5;
  WasmElementSegment *pWVar6;
  undefined4 *puVar7;
  WasmDataSegment *this_00;
  WebAssemblyModule *pWVar8;
  int32 hCode;
  ulong uVar9;
  WasmNode local_68;
  WebAssemblyMemory *local_40;
  ScriptContext *local_38;
  
  this->offsetInitialized = true;
  local_38 = (((((((this->module).ptr)->super_DynamicObject).super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((table == (WebAssemblyTable *)0x0) || (memory == (WebAssemblyMemory *)0x0)) {
    JavascriptError::ThrowTypeError(local_38,-0x7ff5ec71,(PCWSTR)0x0);
  }
  pWVar8 = (this->module).ptr;
  local_40 = memory;
  if (pWVar8->m_elementsegCount != 0) {
    uVar9 = 0;
    do {
      pWVar6 = WebAssemblyModule::GetElementSeg(pWVar8,(uint32)uVar9);
      local_68.op = (pWVar6->m_offsetExpr).op;
      local_68._2_6_ = *(undefined6 *)&(pWVar6->m_offsetExpr).field_0x2;
      local_68.field_1.block = (pWVar6->m_offsetExpr).field_1.block;
      local_68.field_1.brTable.targetTable = (pWVar6->m_offsetExpr).field_1.brTable.targetTable;
      local_68.field_1._16_8_ = *(undefined8 *)((long)&(pWVar6->m_offsetExpr).field_1 + 0x10);
      uVar3 = WebAssemblyModule::GetOffsetFromInit((this->module).ptr,&local_68,this);
      uVar5 = pWVar6->m_numElem;
      if (CARRY4(uVar5,uVar3)) {
LAB_00d99724:
        hCode = -0x7ff5e499;
        goto LAB_00d99738;
      }
      uVar4 = WebAssemblyTable::GetCurrentLength(table);
      if (uVar4 < uVar5 + uVar3) goto LAB_00d99724;
      this->elementSegmentOffsets[uVar9] = uVar3;
      uVar9 = uVar9 + 1;
      pWVar8 = (this->module).ptr;
    } while (uVar9 < pWVar8->m_elementsegCount);
  }
  local_40 = (WebAssemblyMemory *)WebAssemblyMemory::GetBuffer(local_40);
  if (*(Type *)&(local_40->m_buffer).ptr != false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xd7,"(!buffer->IsDetached())","!buffer->IsDetached()");
    if (!bVar2) {
LAB_00d9973f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  pWVar8 = (this->module).ptr;
  if (pWVar8->m_datasegCount != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar9 = 0;
    do {
      this_00 = WebAssemblyModule::GetDataSeg(pWVar8,(uint32)uVar9);
      if (this_00 == (WasmDataSegment *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                    ,0xdc,"(segment != nullptr)","segment != nullptr");
        if (!bVar2) goto LAB_00d9973f;
        *puVar7 = 0;
      }
      local_68.op = (this_00->m_initExpr).op;
      local_68._2_6_ = *(undefined6 *)&(this_00->m_initExpr).field_0x2;
      local_68.field_1.block = (this_00->m_initExpr).field_1.block;
      local_68.field_1.brTable.targetTable = (this_00->m_initExpr).field_1.brTable.targetTable;
      local_68.field_1._16_8_ = *(undefined8 *)((long)&(this_00->m_initExpr).field_1 + 0x10);
      uVar3 = WebAssemblyModule::GetOffsetFromInit((this->module).ptr,&local_68,this);
      uVar4 = Wasm::WasmDataSegment::GetSourceSize(this_00);
      if (CARRY4(uVar4,uVar3)) {
LAB_00d9972f:
        hCode = -0x7ff5e4a4;
LAB_00d99738:
        JavascriptError::ThrowWebAssemblyLinkError(local_38,hCode,(PCWSTR)0x0);
      }
      uVar5 = (*(local_40->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])();
      if (uVar5 < uVar4 + uVar3) goto LAB_00d9972f;
      this->dataSegmentOffsets[uVar9] = uVar3;
      uVar9 = uVar9 + 1;
      pWVar8 = (this->module).ptr;
    } while (uVar9 < pWVar8->m_datasegCount);
  }
  return;
}

Assistant:

void WebAssemblyEnvironment::CalculateOffsets(WebAssemblyTable* table, WebAssemblyMemory* memory)
{
    DebugOnly(offsetInitialized = true);
    ScriptContext* scriptContext = module->GetScriptContext();
    if (!table || !memory)
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
    }

    int32 hCode = WASMERR_ElementSegOutOfRange;
    auto outOfRangeError = [scriptContext, &hCode] { JavascriptError::ThrowWebAssemblyLinkError(scriptContext, hCode); };

    for (uint elementsIndex = 0; elementsIndex < module->GetElementSegCount(); ++elementsIndex)
    {
        Wasm::WasmElementSegment* eSeg = module->GetElementSeg(elementsIndex);
        uint offset = module->GetOffsetFromInit(eSeg->GetOffsetExpr(), this);
        if (UInt32Math::Add(offset, eSeg->GetNumElements(), outOfRangeError) > table->GetCurrentLength())
        {
            outOfRangeError();
        }
        this->elementSegmentOffsets[elementsIndex] = offset;
    }

    ArrayBufferBase* buffer = memory->GetBuffer();
    Assert(!buffer->IsDetached());
    hCode = WASMERR_DataSegOutOfRange;
    for (uint32 iSeg = 0; iSeg < module->GetDataSegCount(); ++iSeg)
    {
        Wasm::WasmDataSegment* segment = module->GetDataSeg(iSeg);
        Assert(segment != nullptr);
        const uint32 offset = module->GetOffsetFromInit(segment->GetOffsetExpr(), this);
        const uint32 size = segment->GetSourceSize();

        if (UInt32Math::Add(offset, size, outOfRangeError) > buffer->GetByteLength())
        {
            outOfRangeError();
        }
        this->dataSegmentOffsets[iSeg] = offset;
    }
}